

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QThreadPoolThread_*>::begin(QList<QThreadPoolThread_*> *this)

{
  QThreadPoolThread **n;
  QArrayDataPointer<QThreadPoolThread_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QThreadPoolThread_*> *)0x6d2cb9);
  QArrayDataPointer<QThreadPoolThread_*>::operator->(in_RDI);
  n = QArrayDataPointer<QThreadPoolThread_*>::begin
                ((QArrayDataPointer<QThreadPoolThread_*> *)0x6d2cca);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }